

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O2

content_type * __thiscall
cppcms::http::content_type::operator=(content_type *this,content_type *other)

{
  std::__shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2> *)other);
  return this;
}

Assistant:

content_type &content_type::operator=(content_type &&other)
	{
		d=std::move(other.d);
		return *this;
	}